

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void duckdb::ListRangeFunction<duckdb::TimestampRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  reference pvVar5;
  uint64_t uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  long lVar9;
  timestamp_t tVar10;
  idx_t iVar11;
  size_type __n;
  uint64_t *puVar12;
  idx_t row_idx;
  long lVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  INCREMENT_TYPE IVar15;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true> info;
  uint64_t local_178;
  idx_t local_170;
  long local_150;
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  Vector *local_130;
  long local_128;
  idx_t local_120;
  unsigned_long local_118;
  undefined1 local_110 [16];
  long local_100;
  
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct
            ((RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *)local_110,args);
  local_170 = 1;
  if (*(long *)(args + 8) != *(long *)args) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,__n);
      if (*pvVar5 != (value_type)0x2) {
        local_170 = *(idx_t *)(args + 0x18);
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  lVar13 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (local_170 == 0) {
    local_178 = 0;
  }
  else {
    puVar12 = (uint64_t *)(lVar13 + 8);
    uVar14 = 0;
    local_178 = 0;
    do {
      bVar4 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RowIsValid
                        ((RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *)local_110,uVar14);
      if (bVar4) {
        puVar12[-1] = local_178;
        uVar6 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListLength
                          ((RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *)local_110,uVar14);
        *puVar12 = uVar6;
        local_178 = local_178 + uVar6;
      }
      else {
        _Var8._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_118 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_148,&local_118);
          p_Var3 = p_Stack_140;
          uVar2 = local_148;
          local_148 = 0;
          p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar2;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var3;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              (result + 0x30));
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var8._M_head_impl;
        }
        bVar1 = (byte)uVar14 & 0x3f;
        _Var8._M_head_impl[uVar14 >> 6] =
             _Var8._M_head_impl[uVar14 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        puVar12[-1] = local_178;
        *puVar12 = 0;
      }
      uVar14 = uVar14 + 1;
      puVar12 = puVar12 + 2;
    } while (local_170 != uVar14);
  }
  duckdb::ListVector::Reserve(result,local_178);
  lVar9 = duckdb::ListVector::GetEntry(result);
  if (local_170 != 0) {
    local_128 = *(long *)(lVar9 + 0x20);
    row_idx = 0;
    local_150 = 0;
    local_130 = result;
    do {
      if (*(long *)(local_110._0_8_ + 8) - *(long *)local_110._0_8_ == 0x68) {
        tVar10 = TimestampRangeInfo::DefaultStart();
      }
      else {
        iVar11 = row_idx;
        if (*(long *)local_110._8_8_ != 0) {
          iVar11 = (idx_t)*(uint *)(*(long *)local_110._8_8_ + row_idx * 4);
        }
        tVar10.value = *(int64_t *)(local_100 + iVar11 * 8);
      }
      IVar15 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListIncrementValue
                         ((RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *)local_110,row_idx);
      local_120 = row_idx;
      if (*(long *)(lVar13 + 8 + row_idx * 0x10) != 0) {
        lVar9 = local_128 + local_150 * 8;
        uVar14 = 0;
        do {
          if (uVar14 != 0) {
            tVar10.value = duckdb::Interval::Add(tVar10,IVar15);
          }
          *(int64_t *)(lVar9 + uVar14 * 8) = tVar10.value;
          uVar14 = uVar14 + 1;
        } while (uVar14 < *(ulong *)(lVar13 + row_idx * 0x10 + 8));
        local_150 = local_150 + uVar14;
        result = local_130;
      }
      row_idx = local_120 + 1;
    } while (row_idx != local_170);
  }
  duckdb::ListVector::SetListSize(result,local_178);
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::Vector::Verify((ulong)result);
  lVar13 = 0xd8;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_110 + lVar13) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_110 + lVar13));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar13) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar13));
    }
    lVar13 = lVar13 + -0x48;
  } while (lVar13 != 0);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}